

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTRealTraffic.cpp
# Opt level: O0

void __thiscall
RealTrafficConnection::ProcessCloudLayer(RealTrafficConnection *this,JSON_Object *pCL,size_t i)

{
  uint uVar1;
  reference pvVar2;
  long in_RSI;
  JSON_Object *in_RDI;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  double dVar8;
  float conf;
  float type;
  float tops;
  float base;
  float cover;
  undefined4 in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  
  if (in_RSI != 0) {
    dVar7 = jog_n_nan(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    dVar8 = jog_n_nan(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    fVar3 = (float)dVar8;
    dVar8 = jog_n_nan(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    fVar4 = (float)dVar8;
    dVar8 = jog_n_nan(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    fVar5 = (float)dVar8;
    dVar8 = jog_n_nan(in_RDI,(char *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    uVar1 = std::isnan((double)(ulong)(uint)(float)dVar7);
    if (((((uVar1 & 1) == 0) && (uVar1 = std::isnan((double)(ulong)(uint)fVar3), (uVar1 & 1) == 0))
        && (uVar1 = std::isnan((double)(ulong)(uint)fVar4), (uVar1 & 1) == 0)) &&
       ((uVar1 = std::isnan((double)(ulong)(uint)fVar5), (uVar1 & 1) == 0 &&
        (uVar1 = std::isnan((double)(ulong)(uint)(float)dVar8), (uVar1 & 1) == 0)))) {
      pvVar2 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          CONCAT44(in_stack_ffffffffffffffbc,fVar5));
      *pvVar2 = fVar5;
      fVar6 = (float)dVar7 / 100.0;
      pvVar2 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)
                          CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                          CONCAT44(fVar6,fVar5));
      *pvVar2 = fVar6;
      pvVar2 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)CONCAT44(in_stack_ffffffffffffffc4,fVar3),
                          CONCAT44(fVar6,fVar5));
      *pvVar2 = fVar3;
      pvVar2 = std::array<float,_3UL>::operator[]
                         ((array<float,_3UL> *)CONCAT44(fVar4,fVar3),CONCAT44(fVar6,fVar5));
      *pvVar2 = fVar4;
    }
  }
  return;
}

Assistant:

void RealTrafficConnection::ProcessCloudLayer(const JSON_Object* pCL, size_t i)
{
    if (!pCL) return;
    const float cover = (float) jog_n_nan(pCL, "cover");
    const float base  = (float) jog_n_nan(pCL, "base");
    const float tops  = (float) jog_n_nan(pCL, "tops");
    const float type  = (float) jog_n_nan(pCL, "type");
    const float conf  = (float) jog_n_nan(pCL, "confidence");
    if (std::isnan(cover) || std::isnan(base) || std::isnan(tops) || std::isnan(type) || std::isnan(conf))
        return;
    
    rtWx.w.cloud_type[i]             = type;
    rtWx.w.cloud_coverage_percent[i] = cover/100.0f;
    rtWx.w.cloud_base_msl_m[i]       = base;
    rtWx.w.cloud_tops_msl_m[i]       = tops;
}